

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i32 gen_addr_index(DisasContext_conflict2 *s,uint16_t ext,TCGv_i32 tmp)

{
  TCGContext_conflict2 *tcg_ctx_00;
  uint arg2;
  TCGv_i32 local_40;
  TCGv_i32 pTStack_30;
  int scale;
  TCGv_i32 add;
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 tmp_local;
  uint16_t ext_local;
  DisasContext_conflict2 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((ext & 0x8000) == 0) {
    local_40 = tcg_ctx_00->cpu_dregs[(int)((int)(uint)ext >> 0xc & 7)];
  }
  else {
    local_40 = get_areg(s,(int)(uint)ext >> 0xc & 7);
  }
  pTStack_30 = local_40;
  if ((ext & 0x800) == 0) {
    tcg_gen_ext16s_i32_m68k(tcg_ctx_00,tmp,local_40);
    pTStack_30 = tmp;
  }
  arg2 = (int)(uint)ext >> 9 & 3;
  if (arg2 != 0) {
    tcg_gen_shli_i32_m68k(tcg_ctx_00,tmp,pTStack_30,arg2);
    pTStack_30 = tmp;
  }
  return pTStack_30;
}

Assistant:

static TCGv gen_addr_index(DisasContext *s, uint16_t ext, TCGv tmp)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv add;
    int scale;

    add = (ext & 0x8000) ? AREG(ext, 12) : DREG(ext, 12);
    if ((ext & 0x800) == 0) {
        tcg_gen_ext16s_i32(tcg_ctx, tmp, add);
        add = tmp;
    }
    scale = (ext >> 9) & 3;
    if (scale != 0) {
        tcg_gen_shli_i32(tcg_ctx, tmp, add, scale);
        add = tmp;
    }
    return add;
}